

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.c
# Opt level: O0

BOOL reduce_switch(List *list,SymbolTable *sym,int macro_level)

{
  ListStruct *pLVar1;
  List *local_40;
  List *match;
  List *tmp;
  List *ls;
  int macro_level_local;
  SymbolTable *sym_local;
  List *list_local;
  
  pLVar1 = list->car;
  local_40 = (List *)0x0;
  if ((pLVar1->cdr->token).type == TOK_NUMBER) {
    for (match = pLVar1->cdr->cdr; match != (List *)0x0; match = match->cdr) {
      if ((match->car->token).type == TOK_DEFAULT) {
        local_40 = match->car->cdr;
      }
      else if ((match->car->token).type == TOK_NUMBER) {
        if ((match->car->token).u.string == (pLVar1->cdr->token).u.string) {
          local_40 = match->car->cdr;
          break;
        }
      }
      else {
        parse_error(match->car,"Expecting a number for switch case value.\n");
      }
    }
    if (local_40 == (List *)0x0) {
      (list->token).type = TOK_EMPTY;
      list_local._4_4_ = FALSE;
    }
    else {
      replace_list(list,local_40);
      list_local._4_4_ = TRUE;
    }
  }
  else {
    list_local._4_4_ = FALSE;
  }
  return list_local._4_4_;
}

Assistant:

static BOOL
reduce_switch (List *list, const SymbolTable *sym, int macro_level)
{
  List *ls = list->car, *tmp;
  List *match = NULL;

  /* We can only reduce switches on compile-time constants. */
  if (ls->cdr->token.type != TOK_NUMBER)
    return FALSE;

  /* Loop over all of the switch clauses and find the first one that
   * matches.
   */
  for (tmp = CDDR (ls); tmp != NULL; tmp = tmp->cdr)
    {
      if (tmp->car->token.type == TOK_DEFAULT)
	match = CDAR (tmp);   /* Make this the default. */
      else if (tmp->car->token.type != TOK_NUMBER)
	parse_error (tmp->car, "Expecting a number for switch case value.\n");
      else if (tmp->car->token.u.n == ls->cdr->token.u.n)
	{
	  match = CDAR (tmp);
	  break;
	}
    }

  /* If the switch didn't hit ANYTHING, replace with a TOK_EMPTY. */
  if (match == NULL)
    list->token.type = TOK_EMPTY;
  else
    {
      replace_list (list, match);
      return TRUE;
    }

  return FALSE;
}